

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O1

int __thiscall QMessageBox::open(QMessageBox *this,char *__file,int __oflag,...)

{
  long lVar1;
  int *piVar2;
  char *pcVar3;
  undefined8 uVar4;
  int __oflag_00;
  char *pcVar5;
  long in_FS_OFFSET;
  QObject local_40 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QDialog).super_QWidget.field_0x8;
  if (___oflag == (char *)0x0) {
    pcVar5 = "2finished(int)";
  }
  else {
    pcVar3 = strchr(___oflag,0x2a);
    pcVar5 = "2buttonClicked(QAbstractButton*)";
    if (pcVar3 == (char *)0x0) {
      pcVar5 = "2finished(int)";
    }
  }
  uVar4 = 0;
  QObject::connect(local_40,(char *)this,(QObject *)pcVar5,__file,(ConnectionType)___oflag);
  QMetaObject::Connection::~Connection((Connection *)local_40);
  QByteArray::operator=((QByteArray *)(lVar1 + 0x388),pcVar5);
  if (__file != (char *)0x0) {
    uVar4 = QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)__file);
  }
  piVar2 = *(int **)(lVar1 + 0x360);
  *(undefined8 *)(lVar1 + 0x360) = uVar4;
  *(char **)(lVar1 + 0x368) = __file;
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      operator_delete(piVar2);
    }
  }
  QByteArray::operator=((QByteArray *)(lVar1 + 0x370),___oflag);
  QDialog::open(&this->super_QDialog,___oflag,__oflag_00);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (int)*(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void QMessageBox::open(QObject *receiver, const char *member)
{
    Q_D(QMessageBox);
    const char *signal = member && strchr(member, '*') ? SIGNAL(buttonClicked(QAbstractButton*))
                                                       : SIGNAL(finished(int));
    connect(this, signal, receiver, member);
    d->signalToDisconnectOnClose = signal;
    d->receiverToDisconnectOnClose = receiver;
    d->memberToDisconnectOnClose = member;
    QDialog::open();
}